

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchAndModifiedInterleaveProperly_Test::TestBody
          (MatchingTest_MatchAndModifiedInterleaveProperly_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestDiffMessage_Item> *pRVar1;
  Descriptor *pDVar2;
  FieldDescriptor *this_00;
  FieldDescriptor *key;
  FieldDescriptor *this_01;
  FieldDescriptor *key_00;
  FieldDescriptor *field;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>_>
  *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>_> *pVVar4;
  char *message;
  undefined1 in_R9B;
  RepeatedPtrField<proto2_unittest::TestField> *pRVar5;
  RepeatedField<int> *pRVar6;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  AssertHelper local_380;
  AssertionResult gtest_ar;
  string local_368;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  pDVar2 = proto2_unittest::TestDiffMessage::GetDescriptor();
  name._M_str = "item";
  name._M_len = 4;
  this_00 = Descriptor::FindFieldByName(pDVar2,name);
  pDVar2 = FieldDescriptor::message_type(this_00);
  name_00._M_str = "a";
  name_00._M_len = 1;
  key = Descriptor::FindFieldByName(pDVar2,name_00);
  pDVar2 = FieldDescriptor::message_type(this_00);
  name_01._M_str = "rm";
  name_01._M_len = 2;
  this_01 = Descriptor::FindFieldByName(pDVar2,name_01);
  pDVar2 = FieldDescriptor::message_type(this_01);
  name_02._M_str = "c";
  name_02._M_len = 1;
  key_00 = Descriptor::FindFieldByName(pDVar2,name_02);
  pDVar2 = FieldDescriptor::message_type(this_01);
  name_03._M_str = "rc";
  name_03._M_len = 2;
  field = Descriptor::FindFieldByName(pDVar2,name_03);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::TreatAsMap(&differencer,this_00,key);
  util::MessageDifferencer::TreatAsMap(&differencer,this_01,key_00);
  util::MessageDifferencer::TreatAsSet(&differencer,field);
  pRVar1 = &msg1.field_0._impl_.item_;
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.a_ = 1;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 4;
  pRVar5 = &(pVVar3->field_0)._impl_.rm_;
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar5->super_RepeatedPtrFieldBase);
  (pVVar4->field_0)._impl_.c_ = 2;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
  pRVar6 = &(pVVar4->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar6,3);
  RepeatedField<int>::Add(pRVar6,4);
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar5->super_RepeatedPtrFieldBase);
  (pVVar4->field_0)._impl_.c_ = 5;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
  pRVar6 = &(pVVar4->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar6,6);
  RepeatedField<int>::Add(pRVar6,7);
  RepeatedField<int>::Add(pRVar6,8);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.a_ = 9;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 4;
  pRVar5 = &(pVVar3->field_0)._impl_.rm_;
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar5->super_RepeatedPtrFieldBase);
  (pVVar4->field_0)._impl_.c_ = 10;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
  pRVar6 = &(pVVar4->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar6,0xb);
  RepeatedField<int>::Add(pRVar6,0xc);
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar5->super_RepeatedPtrFieldBase);
  (pVVar4->field_0)._impl_.c_ = 0xd;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
  pRVar1 = &msg2.field_0._impl_.item_;
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.a_ = 1;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 4;
  pRVar5 = &(pVVar3->field_0)._impl_.rm_;
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar5->super_RepeatedPtrFieldBase);
  (pVVar4->field_0)._impl_.c_ = 5;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
  pRVar6 = &(pVVar4->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar6,8);
  RepeatedField<int>::Add(pRVar6,8);
  RepeatedField<int>::Add(pRVar6,6);
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar5->super_RepeatedPtrFieldBase);
  (pVVar4->field_0)._impl_.c_ = 3;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
  pRVar6 = &(pVVar4->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar6,2);
  RepeatedField<int>::Add(pRVar6,4);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.a_ = 9;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 4;
  pRVar5 = &(pVVar3->field_0)._impl_.rm_;
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar5->super_RepeatedPtrFieldBase);
  (pVVar4->field_0)._impl_.c_ = 10;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
  pRVar6 = &(pVVar4->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar6,0xc);
  RepeatedField<int>::Add(pRVar6,0xb);
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar5->super_RepeatedPtrFieldBase);
  (pVVar4->field_0)._impl_.c_ = 0xd;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
  protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
            (&local_368,&differencer,(MessageDifferencer *)&msg1,&msg2.super_Message,(Message *)0x0,
             (bool)in_R9B);
  testing::internal::CmpHelperEQ<char[922],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"matched: item[0].a : 1\\n\" \"matched: item[0].rm[1].c -> item[0].rm[0].c : 5\\n\" \"moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\\n\" \"moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\\n\" \"added: item[0].rm[0].rc[1]: 8\\n\" \"deleted: item[0].rm[1].rc[1]: 7\\n\" \"modified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } ->\" \" { c: 5 rc: 8 rc: 8 rc: 6 }\\n\" \"added: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\\n\" \"deleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\\n\" \"modified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 }\" \" rm { c: 5 rc: 6 rc: 7 rc: 8 } } ->\" \" { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 }\" \" rm { c: 3 rc: 2 rc: 4 } }\\n\" \"matched: item[1].a : 9\\n\" \"matched: item[1].rm[0].c : 10\\n\" \"moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\\n\" \"moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\\n\" \"matched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\\n\" \"matched: item[1].rm[1].c : 13\\n\" \"matched: item[1].rm[1] : { c: 13 }\\n\" \"matched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\\n\""
             ,"RunWithResult(&differencer, msg1, msg2, false)",
             (char (*) [922])
             "matched: item[0].a : 1\nmatched: item[0].rm[1].c -> item[0].rm[0].c : 5\nmoved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\nmoved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\nadded: item[0].rm[0].rc[1]: 8\ndeleted: item[0].rm[1].rc[1]: 7\nmodified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } -> { c: 5 rc: 8 rc: 8 rc: 6 }\nadded: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\ndeleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\nmodified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 } rm { c: 5 rc: 6 rc: 7 rc: 8 } } -> { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 } rm { c: 3 rc: 2 rc: 4 } }\nmatched: item[1].a : 9\nmatched: item[1].rm[0].c : 10\nmoved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\nmoved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\nmatched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\nmatched: item[1].rm[1].c : 13\nmatched: item[1].rm[1] : { c: 13 }\nmatched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\n"
             ,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_368);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1078,message);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((long *)local_368._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_368._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST_F(MatchingTest, MatchAndModifiedInterleaveProperly) {
  proto2_unittest::TestDiffMessage msg1, msg2;
  proto2_unittest::TestDiffMessage::Item* item;
  proto2_unittest::TestField* field;

  const FieldDescriptor* desc;
  const FieldDescriptor* nested_key;
  const FieldDescriptor* nested_desc;
  const FieldDescriptor* double_nested_key;
  const FieldDescriptor* double_nested_desc;
  desc = msg1.GetDescriptor()->FindFieldByName("item");
  nested_key = desc->message_type()->FindFieldByName("a");
  nested_desc = desc->message_type()->FindFieldByName("rm");
  double_nested_key = nested_desc->message_type()->FindFieldByName("c");
  double_nested_desc = nested_desc->message_type()->FindFieldByName("rc");

  MessageDifferencer differencer;
  differencer.TreatAsMap(desc, nested_key);
  differencer.TreatAsMap(nested_desc, double_nested_key);
  differencer.TreatAsSet(double_nested_desc);

  item = msg1.add_item();
  item->set_a(1);
  field = item->add_rm();
  field->set_c(2);
  field->add_rc(3);
  field->add_rc(4);
  field = item->add_rm();
  field->set_c(5);
  field->add_rc(6);
  field->add_rc(7);
  field->add_rc(8);
  item = msg1.add_item();
  item->set_a(9);
  field = item->add_rm();
  field->set_c(10);
  field->add_rc(11);
  field->add_rc(12);
  field = item->add_rm();
  field->set_c(13);

  item = msg2.add_item();
  item->set_a(1);
  field = item->add_rm();
  field->set_c(5);
  field->add_rc(8);
  field->add_rc(8);
  field->add_rc(6);
  field = item->add_rm();
  field->set_c(3);
  field->add_rc(2);
  field->add_rc(4);
  item = msg2.add_item();
  item->set_a(9);
  field = item->add_rm();
  field->set_c(10);
  field->add_rc(12);
  field->add_rc(11);
  field = item->add_rm();
  field->set_c(13);

  EXPECT_EQ(
      "matched: item[0].a : 1\n"
      "matched: item[0].rm[1].c -> item[0].rm[0].c : 5\n"
      "moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 6\n"
      "moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 8\n"
      "added: item[0].rm[0].rc[1]: 8\n"
      "deleted: item[0].rm[1].rc[1]: 7\n"
      "modified: item[0].rm[1] -> item[0].rm[0]: { c: 5 rc: 6 rc: 7 rc: 8 } ->"
      " { c: 5 rc: 8 rc: 8 rc: 6 }\n"
      "added: item[0].rm[1]: { c: 3 rc: 2 rc: 4 }\n"
      "deleted: item[0].rm[0]: { c: 2 rc: 3 rc: 4 }\n"
      "modified: item[0]: { a: 1 rm { c: 2 rc: 3 rc: 4 }"
      " rm { c: 5 rc: 6 rc: 7 rc: 8 } } ->"
      " { a: 1 rm { c: 5 rc: 8 rc: 8 rc: 6 }"
      " rm { c: 3 rc: 2 rc: 4 } }\n"
      "matched: item[1].a : 9\n"
      "matched: item[1].rm[0].c : 10\n"
      "moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 11\n"
      "moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[0] : 12\n"
      "matched: item[1].rm[0] : { c: 10 rc: 11 rc: 12 }\n"
      "matched: item[1].rm[1].c : 13\n"
      "matched: item[1].rm[1] : { c: 13 }\n"
      "matched: item[1] : { a: 9 rm { c: 10 rc: 11 rc: 12 } rm { c: 13 } }\n",
      RunWithResult(&differencer, msg1, msg2, false));
}